

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall
Catch::Generators::anon_unknown_3::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  GeneratorUntypedBase *pGVar1;
  pointer puVar2;
  ITracker *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int extraout_EAX;
  undefined7 extraout_var;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  _Var7;
  long lVar8;
  long lVar9;
  unique_ptr<Catch::TestCaseTracking::ITracker> *child;
  pointer puVar10;
  GeneratorTracker *pGVar11;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  _Var7._M_current =
       (StringRef *)
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (GeneratorUntypedBase *)
           (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((GeneratorUntypedBase *)_Var7._M_current != pGVar1) {
    lVar8 = (long)pGVar1 - (long)_Var7._M_current;
    for (lVar9 = lVar8 >> 5; pGVar11 = this, 0 < lVar9; lVar9 = lVar9 + -1) {
      if (*(int *)(((GeneratorUntypedBase *)_Var7._M_current)->_vptr_GeneratorUntypedBase + 0xb) !=
          0) goto LAB_0014fef1;
      if (*(int *)((((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache)._M_dataplus._M_p
                  + 0x58) != 0) {
        _Var7._M_current =
             (StringRef *)&((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache;
        goto LAB_0014fef1;
      }
      if (*(int *)((((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache)._M_string_length
                  + 0x58) != 0) {
        _Var7._M_current =
             (StringRef *)
             &(((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache)._M_string_length;
        goto LAB_0014fef1;
      }
      if (*(int *)((((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache).field_2.
                   _M_allocated_capacity + 0x58) != 0) {
        _Var7._M_current =
             (StringRef *)&(((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache).field_2;
        goto LAB_0014fef1;
      }
      _Var7._M_current =
           (StringRef *)
           ((((GeneratorUntypedBase *)_Var7._M_current)->m_stringReprCache).field_2._M_local_buf + 8
           );
      lVar8 = lVar8 + -0x20;
    }
    lVar8 = lVar8 >> 3;
    if (lVar8 == 1) {
LAB_0014fed4:
      if (*(int *)(((GeneratorUntypedBase *)_Var7._M_current)->_vptr_GeneratorUntypedBase + 0xb) ==
          0) {
        _Var7._M_current = (StringRef *)pGVar1;
      }
LAB_0014fef1:
      if ((GeneratorUntypedBase *)_Var7._M_current != pGVar1) goto LAB_0014fef6;
    }
    else {
      if (lVar8 == 2) {
LAB_0014fec7:
        if (*(int *)(((GeneratorUntypedBase *)_Var7._M_current)->_vptr_GeneratorUntypedBase + 0xb)
            == 0) {
          _Var7._M_current = (StringRef *)&(_Var7._M_current)->m_size;
          goto LAB_0014fed4;
        }
        goto LAB_0014fef1;
      }
      if (lVar8 == 3) {
        if (*(int *)(((GeneratorUntypedBase *)_Var7._M_current)->_vptr_GeneratorUntypedBase + 0xb)
            == 0) {
          _Var7._M_current = (StringRef *)&(_Var7._M_current)->m_size;
          goto LAB_0014fec7;
        }
        goto LAB_0014fef1;
      }
    }
    do {
      pGVar11 = (GeneratorTracker *)(pGVar11->super_TrackerBase).super_ITracker.m_parent;
      iVar5 = (*(pGVar11->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pGVar11);
    } while ((char)iVar5 == '\0');
    _Var7._M_current = (StringRef *)(pGVar11->super_IGeneratorTracker)._vptr_IGeneratorTracker;
    if ((GeneratorUntypedBase *)_Var7._M_current == (pGVar11->m_generator).m_ptr) goto LAB_0014ff76;
    puVar2 = (this->super_TrackerBase).super_ITracker.m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->super_TrackerBase).super_ITracker.m_children.
                   super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
        puVar10 = puVar10 + 1) {
      uVar6 = (*puVar10->m_ptr->_vptr_ITracker[5])();
      _Var7._M_current = (StringRef *)(ulong)uVar6;
      if ((char)uVar6 != '\0') {
        pIVar3 = puVar10->m_ptr;
        local_38 = *(undefined4 *)((long)&pIVar3[1].m_nameAndLocation.name.field_2 + 8);
        uStack_34 = *(undefined4 *)((long)&pIVar3[1].m_nameAndLocation.name.field_2 + 0xc);
        uStack_30 = *(undefined4 *)&pIVar3[1].m_nameAndLocation.location.file;
        uStack_2c = *(undefined4 *)((long)&pIVar3[1].m_nameAndLocation.location.file + 4);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<Catch::StringRef_const*,std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::StringRef_const>>
                          ((pGVar11->super_IGeneratorTracker)._vptr_IGeneratorTracker,
                           (pGVar11->m_generator).m_ptr,&local_38);
        if ((GeneratorUntypedBase *)_Var7._M_current != (pGVar11->m_generator).m_ptr)
        goto LAB_0014ff76;
      }
    }
  }
LAB_0014fef6:
  if ((this->super_TrackerBase).super_ITracker.m_runState != CompletedSuccessfully) {
    return (int)_Var7._M_current;
  }
  bVar4 = GeneratorUntypedBase::countedNext((this->m_generator).m_ptr);
  if (!bVar4) {
    return (int)CONCAT71(extraout_var,bVar4);
  }
LAB_0014ff76:
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).super_ITracker.m_children);
  (this->super_TrackerBase).super_ITracker.m_runState = Executing;
  return extraout_EAX;
}

Assistant:

void close() override {
                    TrackerBase::close();
                    // If a generator has a child (it is followed by a section)
                    // and none of its children have started, then we must wait
                    // until later to start consuming its values.
                    // This catches cases where `GENERATE` is placed between two
                    // `SECTION`s.
                    // **The check for m_children.empty cannot be removed**.
                    // doing so would break `GENERATE` _not_ followed by
                    // `SECTION`s.
                    const bool should_wait_for_child = [&]() {
                        // No children -> nobody to wait for
                        if ( m_children.empty() ) { return false; }
                        // If at least one child started executing, don't wait
                        if ( std::find_if(
                                 m_children.begin(),
                                 m_children.end(),
                                 []( TestCaseTracking::ITrackerPtr const&
                                         tracker ) {
                                     return tracker->hasStarted();
                                 } ) != m_children.end() ) {
                            return false;
                        }

                        // No children have started. We need to check if they
                        // _can_ start, and thus we should wait for them, or
                        // they cannot start (due to filters), and we shouldn't
                        // wait for them
                        ITracker* parent = m_parent;
                        // This is safe: there is always at least one section
                        // tracker in a test case tracking tree
                        while ( !parent->isSectionTracker() ) {
                            parent = parent->parent();
                        }
                        assert( parent &&
                                "Missing root (test case) level section" );

                        auto const& parentSection =
                            static_cast<SectionTracker const&>( *parent );
                        auto const& filters = parentSection.getFilters();
                        // No filters -> no restrictions on running sections
                        if ( filters.empty() ) { return true; }

                        for ( auto const& child : m_children ) {
                            if ( child->isSectionTracker() &&
                                 std::find( filters.begin(),
                                            filters.end(),
                                            static_cast<SectionTracker const&>(
                                                *child )
                                                .trimmedName() ) !=
                                     filters.end() ) {
                                return true;
                            }
                        }
                        return false;
                    }();

                    // This check is a bit tricky, because m_generator->next()
                    // has a side-effect, where it consumes generator's current
                    // value, but we do not want to invoke the side-effect if
                    // this generator is still waiting for any child to start.
                    assert( m_generator && "Tracker without generator" );
                    if ( should_wait_for_child ||
                         ( m_runState == CompletedSuccessfully &&
                           m_generator->countedNext() ) ) {
                        m_children.clear();
                        m_runState = Executing;
                    }
                }